

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall runtime::VirtualMachine::Equal(VirtualMachine *this)

{
  element_type *peVar1;
  bool val;
  Variable VVar2;
  Variable VVar3;
  Variable var1;
  
  VVar2 = popOpStack(this);
  VVar3 = popOpStack(this);
  var1.field_1 = VVar3.field_1;
  var1._4_4_ = 0;
  var1.type = VVar3.type;
  VVar3._4_4_ = 0;
  VVar3.type = VVar2.type;
  VVar3.field_1.integerValue = VVar2.field_1.integerValue;
  val = variableEquals(this,var1,VVar3);
  pushBoolean(this,val);
  peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar1->programCounter = peVar1->programCounter + 1;
  return;
}

Assistant:

void runtime::VirtualMachine::Equal() {
  Variable second = this->popOpStack();
  Variable first = this->popOpStack();

  this->pushBoolean(this->variableEquals(first, second));
  this->advance();
}